

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

int bam_mplp_auto(bam_mplp_t iter,int *_tid,int *_pos,int *n_plp,bam_pileup1_t **plp)

{
  int iVar1;
  bam_pileup1_t *pbVar2;
  uint64_t *puVar3;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int pos;
  int tid;
  int local_48;
  uint local_44;
  int *local_40;
  int *local_38;
  
  if (iter->n < 1) {
    iter->min = 0xffffffffffffffff;
    iVar1 = 0;
  }
  else {
    puVar3 = iter->pos;
    uVar9 = 0xffffffffffffffff;
    lVar6 = 0;
    lVar8 = 0;
    local_40 = _tid;
    local_38 = _pos;
    do {
      if (*(uint64_t *)((long)puVar3 + lVar6 * 2) == iter->min) {
        pbVar2 = bam_plp_auto(*(bam_plp_t *)((long)iter->iter + lVar6 * 2),(int *)&local_44,
                              &local_48,(int *)((long)iter->n_plp + lVar6));
        *(bam_pileup1_t **)((long)iter->plp + lVar6 * 2) = pbVar2;
        if (*(int *)(*(long *)((long)iter->iter + lVar6 * 2) + 0x38) != 0) {
          return -1;
        }
        puVar3 = iter->pos;
        lVar4 = *(long *)((long)iter->plp + lVar6 * 2);
        uVar7 = (long)local_48 | (ulong)local_44 << 0x20;
        if (lVar4 == 0) {
          uVar7 = 0;
        }
        *(ulong *)((long)puVar3 + lVar6 * 2) = uVar7;
      }
      else {
        lVar4 = *(long *)((long)iter->plp + lVar6 * 2);
      }
      if ((lVar4 != 0) && (uVar7 = *(ulong *)((long)puVar3 + lVar6 * 2), uVar7 < uVar9)) {
        uVar9 = uVar7;
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 4;
    } while (lVar8 < iter->n);
    iter->min = uVar9;
    iVar1 = 0;
    if (uVar9 != 0xffffffffffffffff) {
      *local_40 = (int)(uVar9 >> 0x20);
      *local_38 = (int)uVar9;
      iVar1 = 0;
      if (0 < iter->n) {
        lVar6 = 0;
        iVar1 = 0;
        do {
          if (iter->pos[lVar6] == uVar9) {
            iVar5 = iter->n_plp[lVar6];
            pbVar2 = iter->plp[lVar6];
            iVar1 = iVar1 + 1;
          }
          else {
            iVar5 = 0;
            pbVar2 = (bam_pileup1_t *)0x0;
          }
          n_plp[lVar6] = iVar5;
          plp[lVar6] = pbVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 < iter->n);
      }
    }
  }
  return iVar1;
}

Assistant:

int bam_mplp_auto(bam_mplp_t iter, int *_tid, int *_pos, int *n_plp, const bam_pileup1_t **plp)
{
    int i, ret = 0;
    uint64_t new_min = (uint64_t)-1;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) {
            int tid, pos;
            iter->plp[i] = bam_plp_auto(iter->iter[i], &tid, &pos, &iter->n_plp[i]);
            if ( iter->iter[i]->error ) return -1;
            iter->pos[i] = iter->plp[i] ? (uint64_t)tid<<32 | pos : 0;
        }
        if (iter->plp[i] && iter->pos[i] < new_min) new_min = iter->pos[i];
    }
    iter->min = new_min;
    if (new_min == (uint64_t)-1) return 0;
    *_tid = new_min>>32; *_pos = (uint32_t)new_min;
    for (i = 0; i < iter->n; ++i) {
        if (iter->pos[i] == iter->min) { // FIXME: valgrind reports "uninitialised value(s) at this line"
            n_plp[i] = iter->n_plp[i], plp[i] = iter->plp[i];
            ++ret;
        } else n_plp[i] = 0, plp[i] = 0;
    }
    return ret;
}